

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QString * __thiscall
QTzTimeZonePrivate::comment(QString *__return_storage_ptr__,QTzTimeZonePrivate *this)

{
  Type *this_00;
  long in_FS_OFFSET;
  QTzTimeZone QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)__return_storage_ptr__);
  QHash<QByteArray,_QTzTimeZone>::value(&QStack_38,this_00,&(this->super_QTimeZonePrivate).m_id);
  QString::fromUtf8<void>(__return_storage_ptr__,&QStack_38.comment);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38.comment.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::comment() const
{
    return QString::fromUtf8(tzZones->value(m_id).comment);
}